

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

void stack_node_add_link(StackNode *self,StackLink link,SubtreePool *subtree_pool)

{
  ushort uVar1;
  Subtree self_00;
  StackLink SVar2;
  _Bool _Var3;
  TSSymbol TVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  StackNode *pSVar8;
  TSSymbol TVar9;
  uint uVar10;
  int32_t iVar11;
  int iVar12;
  StackLink *pSVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  
  SVar2 = link;
  if (link.node != self) {
    uVar1 = self->link_count;
    if (uVar1 != 0) {
      lVar15 = 0;
      do {
        self_00 = (Subtree)((Subtree *)((long)&self->links[0].subtree + lVar15))->ptr;
        if (self_00.ptr == link.subtree.ptr) {
LAB_0013225a:
          pSVar8 = *(StackNode **)((long)&self->links[0].node + lVar15);
          if (pSVar8 == link.node) {
            iVar12 = 0;
            if ((((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
               (iVar12 = 0, (link.subtree.ptr)->child_count != 0)) {
              iVar12 = ((link.subtree.ptr)->field_17).field_0.dynamic_precedence;
            }
LAB_00132424:
            iVar11 = 0;
            if ((((ulong)self_00.ptr & 1) == 0) && ((self_00.ptr)->child_count != 0)) {
              iVar11 = ((self_00.ptr)->field_17).field_0.dynamic_precedence;
            }
            if (iVar12 <= iVar11) {
              return;
            }
            ts_subtree_retain(link.subtree);
            ts_subtree_release(subtree_pool,*(Subtree *)((long)&self->links[0].subtree + lVar15));
            *(Subtree *)((long)&self->links[0].subtree + lVar15) = link.subtree;
            iVar12 = 0;
            if ((((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
               (iVar12 = 0, (link.subtree.ptr)->child_count != 0)) {
              iVar12 = ((link.subtree.ptr)->field_17).field_0.dynamic_precedence;
            }
            self->dynamic_precedence = iVar12 + (link.node)->dynamic_precedence;
            return;
          }
LAB_00132268:
          if ((pSVar8->state == (link.node)->state) &&
             ((pSVar8->position).bytes == ((link.node)->position).bytes)) {
            if ((link.node)->link_count != 0) {
              pSVar13 = (link.node)->links;
              uVar16 = 0;
              do {
                stack_node_add_link(*(StackNode **)((long)&self->links[0].node + lVar15),*pSVar13,
                                    subtree_pool);
                uVar16 = uVar16 + 1;
                pSVar13 = pSVar13 + 1;
              } while (uVar16 < (link.node)->link_count);
            }
            iVar12 = (link.node)->dynamic_precedence;
            if (link.subtree.ptr != (SubtreeHeapData *)0x0) {
              iVar7 = 0;
              if ((((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
                 (iVar7 = 0, (link.subtree.ptr)->child_count != 0)) {
                iVar7 = ((link.subtree.ptr)->field_17).field_0.dynamic_precedence;
              }
              iVar12 = iVar12 + iVar7;
            }
            if (iVar12 <= self->dynamic_precedence) {
              return;
            }
            self->dynamic_precedence = iVar12;
            return;
          }
        }
        else if (self_00.ptr != (SubtreeHeapData *)0x0 && link.subtree.ptr != (SubtreeHeapData *)0x0
                ) {
          if (((ulong)self_00.ptr & 1) == 0) {
            TVar4 = (self_00.ptr)->symbol;
          }
          else {
            TVar4 = (TSSymbol)self_00.data.symbol;
          }
          TVar9 = link.subtree._1_2_ & 0xff;
          if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
            TVar9 = (link.subtree.ptr)->symbol;
          }
          if (TVar4 == TVar9) {
            if (((ulong)self_00.ptr & 1) != 0) {
              if (((ulong)self_00.ptr & 0x20) == 0) {
LAB_00132295:
                uVar5 = self_00._2_4_ & 0xff;
                goto LAB_001322a2;
              }
LAB_00132235:
              if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
                if ((((link.subtree.ptr)->field_0x2c & 0x80) != 0) ||
                   ((link.subtree.ptr)->error_cost != 0)) goto LAB_0013225a;
LAB_00132290:
                if (((ulong)self_00.ptr & 1) == 0) goto LAB_0013229f;
                goto LAB_00132295;
              }
              if (((undefined1  [24])link & (undefined1  [24])0x20) == (undefined1  [24])0x0)
              goto LAB_00132290;
              pSVar8 = *(StackNode **)((long)&self->links[0].node + lVar15);
              if (pSVar8 == link.node) {
                iVar12 = 0;
                goto LAB_00132424;
              }
              goto LAB_00132268;
            }
            if ((((self_00.ptr)->field_0x2c & 0x80) != 0) || ((self_00.ptr)->error_cost != 0))
            goto LAB_00132235;
LAB_0013229f:
            uVar5 = ((self_00.ptr)->padding).bytes;
LAB_001322a2:
            uVar6 = link.subtree._2_4_ & 0xff;
            if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
              uVar6 = ((link.subtree.ptr)->padding).bytes;
            }
            if (uVar5 == uVar6) {
              if (((ulong)self_00.ptr & 1) == 0) {
                uVar5 = ((self_00.ptr)->size).bytes;
              }
              else {
                uVar5 = self_00._3_4_ & 0xff;
              }
              uVar6 = link.subtree._3_4_ & 0xff;
              if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
                uVar6 = ((link.subtree.ptr)->size).bytes;
              }
              if (uVar5 == uVar6) {
                uVar6 = 0;
                uVar5 = 0;
                if (((ulong)self_00.ptr & 1) == 0) {
                  uVar5 = (self_00.ptr)->child_count;
                }
                if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
                  uVar6 = (link.subtree.ptr)->child_count;
                }
                if (uVar5 == uVar6) {
                  if (((ulong)self_00.ptr & 1) == 0) {
                    uVar14 = *(uint *)&(self_00.ptr)->field_0x2c >> 2;
                  }
                  else {
                    uVar14 = (uint)((ulong)self_00.ptr >> 3) & 0x1fffffff;
                  }
                  uVar10 = (uint)((ulong)link.subtree.ptr >> 3);
                  if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
                    uVar10 = *(uint *)&(link.subtree.ptr)->field_0x2c >> 2;
                  }
                  if (((uVar14 & 1) == (uVar10 & 1)) &&
                     (_Var3 = ts_subtree_external_scanner_state_eq(self_00,link.subtree), _Var3))
                  goto LAB_0013225a;
                }
              }
            }
          }
        }
        lVar15 = lVar15 + 0x18;
      } while ((ulong)((uint)uVar1 * 8) * 3 != lVar15);
      if (uVar1 == 8) {
        return;
      }
    }
    stack_node_retain(link.node);
    uVar14 = (link.node)->node_count;
    iVar12 = (link.node)->dynamic_precedence;
    uVar1 = self->link_count;
    self->link_count = uVar1 + 1;
    self->links[uVar1].is_pending = link.is_pending;
    *(undefined7 *)&self->links[uVar1].field_0x11 = link._17_7_;
    self->links[uVar1].node = link.node;
    self->links[uVar1].subtree = link.subtree;
    if (link.subtree.ptr != (SubtreeHeapData *)0x0) {
      ts_subtree_retain(link.subtree);
      uVar5 = 1;
      iVar7 = 0;
      if ((((undefined1  [24])SVar2 & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
         (iVar7 = 0, (link.subtree.ptr)->child_count != 0)) {
        uVar5 = ((link.subtree.ptr)->field_17).field_0.node_count;
        iVar7 = ((link.subtree.ptr)->field_17).field_0.dynamic_precedence;
      }
      uVar14 = uVar14 + uVar5;
      iVar12 = iVar12 + iVar7;
    }
    if (self->node_count < uVar14) {
      self->node_count = uVar14;
    }
    if (self->dynamic_precedence < iVar12) {
      self->dynamic_precedence = iVar12;
    }
  }
  return;
}

Assistant:

static void stack_node_add_link(StackNode *self, StackLink link, SubtreePool *subtree_pool) {
  if (link.node == self) return;

  for (int i = 0; i < self->link_count; i++) {
    StackLink *existing_link = &self->links[i];
    if (stack__subtree_is_equivalent(existing_link->subtree, link.subtree)) {
      // In general, we preserve ambiguities until they are removed from the stack
      // during a pop operation where multiple paths lead to the same node. But in
      // the special case where two links directly connect the same pair of nodes,
      // we can safely remove the ambiguity ahead of time without changing behavior.
      if (existing_link->node == link.node) {
        if (
          ts_subtree_dynamic_precedence(link.subtree) >
          ts_subtree_dynamic_precedence(existing_link->subtree)
        ) {
          ts_subtree_retain(link.subtree);
          ts_subtree_release(subtree_pool, existing_link->subtree);
          existing_link->subtree = link.subtree;
          self->dynamic_precedence =
            link.node->dynamic_precedence + ts_subtree_dynamic_precedence(link.subtree);
        }
        return;
      }

      // If the previous nodes are mergeable, merge them recursively.
      if (existing_link->node->state == link.node->state &&
          existing_link->node->position.bytes == link.node->position.bytes) {
        for (int j = 0; j < link.node->link_count; j++) {
          stack_node_add_link(existing_link->node, link.node->links[j], subtree_pool);
        }
        int32_t dynamic_precedence = link.node->dynamic_precedence;
        if (link.subtree.ptr) {
          dynamic_precedence += ts_subtree_dynamic_precedence(link.subtree);
        }
        if (dynamic_precedence > self->dynamic_precedence) {
          self->dynamic_precedence = dynamic_precedence;
        }
        return;
      }
    }
  }

  if (self->link_count == MAX_LINK_COUNT) return;

  stack_node_retain(link.node);
  unsigned node_count = link.node->node_count;
  int dynamic_precedence = link.node->dynamic_precedence;
  self->links[self->link_count++] = link;

  if (link.subtree.ptr) {
    ts_subtree_retain(link.subtree);
    node_count += ts_subtree_node_count(link.subtree);
    dynamic_precedence += ts_subtree_dynamic_precedence(link.subtree);
  }

  if (node_count > self->node_count) self->node_count = node_count;
  if (dynamic_precedence > self->dynamic_precedence) self->dynamic_precedence = dynamic_precedence;
}